

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseF64(WastParser *this,Const *const_,ConstType const_type)

{
  char *s;
  Result RVar1;
  Literal *pLVar2;
  ExpectedNan expected;
  uint64_t f64_bits;
  ExpectedNan local_64;
  Token local_60;
  
  if ((const_type == Expectation) && (RVar1 = ParseExpectedNan(this,&local_64), RVar1.enum_ == Ok))
  {
    Const::set_f64(const_,local_64);
    return (Result)Ok;
  }
  Consume(&local_60,this);
  pLVar2 = Token::literal(&local_60);
  s = (pLVar2->text).data_;
  RVar1 = ParseDouble(pLVar2->type,s,s + (pLVar2->text).size_,(uint64_t *)&local_60);
  Const::set_f64(const_,(uint64_t)local_60.loc.filename.data_);
  return (Result)RVar1.enum_;
}

Assistant:

Result WastParser::ParseF64(Const* const_, ConstType const_type) {
  ExpectedNan expected;
  if (const_type == ConstType::Expectation &&
      Succeeded(ParseExpectedNan(&expected))) {
    const_->set_f64(expected);
    return Result::Ok;
  }
  auto literal = Consume().literal();
  uint64_t f64_bits;
  Result result = ParseDouble(literal.type, literal.text.begin(),
                              literal.text.end(), &f64_bits);
  const_->set_f64(f64_bits);
  return result;
}